

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_update.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,UpdateStatement *stmt)

{
  unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true> *this_00;
  TableCatalogEntry *args;
  __node_base_ptr p_Var1;
  __node_base_ptr p_Var2;
  long lVar3;
  BoundStatement result_00;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> _Var4;
  int iVar5;
  pointer pBVar6;
  BoundBaseTableRef *pBVar7;
  Binder *pBVar8;
  pointer pLVar9;
  reference this_01;
  StatementProperties *pSVar10;
  pointer pLVar11;
  undefined4 extraout_var;
  string *catalog_name;
  undefined4 extraout_var_00;
  ColumnList *columns;
  pointer pUVar12;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  pointer this_02;
  type pLVar13;
  TableCatalogEntry *table;
  LogicalGet *pLVar14;
  type pLVar15;
  pointer pLVar16;
  idx_t update_table_index;
  pointer pTVar17;
  BinderException *this_03;
  pointer *__ptr;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  _Head_base<0UL,_duckdb::LogicalUpdate_*,_false> in_stack_fffffffffffffd48;
  _Head_base<0UL,_duckdb::LogicalUpdate_*,_false> _Var18;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  ClientContext *in_stack_fffffffffffffd58;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> in_stack_fffffffffffffd60;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> _Var20;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> in_stack_fffffffffffffd68;
  __node_base in_stack_fffffffffffffd70;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> local_288;
  undefined1 local_280 [8];
  shared_ptr<duckdb::Binder,_true> from_binder;
  _Head_base<0UL,_duckdb::LogicalUpdate_*,_false> local_260;
  __node_base local_258;
  __node_base local_250;
  optional_ptr<duckdb::LogicalGet,_true> get;
  BoundStatement result;
  BoundJoinRef bound_crossproduct;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_160;
  undefined1 local_148 [56];
  BindContext local_110;
  
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.plan.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*(&stmt->table)
  ;
  Bind((Binder *)&stack0xfffffffffffffd68,(TableRef *)this);
  pBVar6 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
           operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                       *)&stack0xfffffffffffffd68);
  if (pBVar6->type == BASE_TABLE) {
    pBVar6 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                         *)&stack0xfffffffffffffd68);
    pBVar7 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(pBVar6);
    args = pBVar7->table;
    AddCTEMap(this,&stmt->cte_map);
    get.ptr = (LogicalGet *)0x0;
    if ((stmt->from_table).
        super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
        super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl == (TableRef *)0x0) {
      unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
                ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                  *)&stack0xfffffffffffffd68);
      CreatePlan((Binder *)&bound_crossproduct,(BoundTableRef *)this);
      _Var18._M_head_impl =
           (LogicalUpdate *)bound_crossproduct.super_BoundTableRef._vptr_BoundTableRef;
      bound_crossproduct.super_BoundTableRef._vptr_BoundTableRef = (_func_int **)0x0;
      if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(_Var19._M_pi)->_vptr__Sp_counted_base[1])();
        if (bound_crossproduct.super_BoundTableRef._vptr_BoundTableRef != (_func_int **)0x0) {
          (**(code **)(*bound_crossproduct.super_BoundTableRef._vptr_BoundTableRef + 8))();
        }
      }
      pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&stack0xfffffffffffffd50);
      get.ptr = LogicalOperator::Cast<duckdb::LogicalGet>(pLVar9);
    }
    else {
      CreateBinder((Binder *)&from_binder,this->context,(optional_ptr<duckdb::Binder,_true>)this,
                   REGULAR_BINDER);
      bound_crossproduct.super_BoundTableRef.type = JOIN;
      bound_crossproduct.super_BoundTableRef.sample.
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
           (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
           (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
            )0x0;
      bound_crossproduct.super_BoundTableRef._vptr_BoundTableRef =
           (_func_int **)&PTR__BoundJoinRef_027a3d50;
      bound_crossproduct.right.
      super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
            )0x0;
      bound_crossproduct.left_binder.internal.
      super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      bound_crossproduct.left_binder.internal.
      super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bound_crossproduct.right_binder.internal.
      super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      bound_crossproduct.right_binder.internal.
      super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bound_crossproduct.condition.
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      bound_crossproduct.duplicate_eliminated_columns.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bound_crossproduct.duplicate_eliminated_columns.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bound_crossproduct.duplicate_eliminated_columns.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bound_crossproduct.type = INNER;
      bound_crossproduct.ref_type = CROSS;
      bound_crossproduct.lateral = false;
      bound_crossproduct.correlated_columns.
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bound_crossproduct.correlated_columns.
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bound_crossproduct.correlated_columns.
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bound_crossproduct.mark_index = 0;
      in_stack_fffffffffffffd68._M_head_impl = (BoundTableRef *)0x0;
      pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(&from_binder);
      unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                (&stmt->from_table);
      Bind((Binder *)&stack0xfffffffffffffd48,(TableRef *)pBVar8);
      _Var18._M_head_impl = (LogicalUpdate *)0x0;
      if (bound_crossproduct.right.
          super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
          .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)bound_crossproduct.right.
                              super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
                              .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl +
                    8))();
        if ((element_type *)_Var18._M_head_impl != (element_type *)0x0) {
          (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                       &((_Var18._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)->
                      internal).super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
      }
      CreatePlan((Binder *)&stack0xfffffffffffffd48,(BoundJoinRef *)this);
      in_stack_fffffffffffffd48._M_head_impl = (LogicalUpdate *)0x0;
      if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(_Var19._M_pi)->_vptr__Sp_counted_base[1])();
        if ((_Head_base<0UL,_duckdb::LogicalUpdate_*,_false>)in_stack_fffffffffffffd48._M_head_impl
            != (_Head_base<0UL,_duckdb::LogicalUpdate_*,_false>)0x0) {
          (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                       &((in_stack_fffffffffffffd48._M_head_impl)->super_LogicalOperator).
                        _vptr_LogicalOperator)->internal).
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
      }
      pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&stack0xfffffffffffffd50);
      this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar9->children,0);
      pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(this_01);
      get.ptr = LogicalOperator::Cast<duckdb::LogicalGet>(pLVar9);
      pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->(&from_binder);
      BindContext::BindContext(&local_110,&pBVar8->bind_context);
      BindContext::AddContext(&this->bind_context,&local_110);
      BindContext::~BindContext(&local_110);
      BoundJoinRef::~BoundJoinRef(&bound_crossproduct);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&from_binder.internal.
                  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    if ((args->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary == false) {
      pSVar10 = GetStatementProperties(this);
      StatementProperties::RegisterDBModify
                (pSVar10,(args->super_StandardEntry).super_InCatalogEntry.catalog,this->context);
    }
    make_uniq<duckdb::LogicalUpdate,duckdb::TableCatalogEntry&>
              ((duckdb *)&stack0xfffffffffffffd48,args);
    if ((stmt->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (stmt->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar11 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                ::operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                              *)&stack0xfffffffffffffd48);
      pLVar11->return_chunk = true;
    }
    iVar5 = (*(args->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
              [0xb])(args);
    catalog_name = Catalog::GetName_abi_cxx11_((Catalog *)CONCAT44(extraout_var,iVar5));
    iVar5 = (*(args->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
              [0xd])(args);
    columns = TableCatalogEntry::GetColumns(args);
    pLVar11 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd48);
    BindDefaultValues(this,columns,&pLVar11->bound_defaults,catalog_name,
                      (string *)(CONCAT44(extraout_var_00,iVar5) + 0x20));
    BindConstraints((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                     *)&bound_crossproduct,this,args);
    pLVar11 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd48);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::_M_move_assign(&(pLVar11->bound_constraints).
                      super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                     ,&bound_crossproduct);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&bound_crossproduct);
    this_00 = &stmt->set_info;
    pUVar12 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
              operator->(this_00);
    if ((ParsedExpression *)
        (pUVar12->condition).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> != (ParsedExpression *)0x0) {
      WhereBinder::WhereBinder
                ((WhereBinder *)&bound_crossproduct,this,this->context,
                 (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
      result_type.ptr =
           (LogicalType *)
           unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
           operator->(this_00);
      ExpressionBinder::Bind
                ((ExpressionBinder *)&from_binder,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&bound_crossproduct,result_type,false);
      PlanSubqueries(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&from_binder,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&stack0xfffffffffffffd50);
      make_uniq<duckdb::LogicalFilter,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&stack0xfffffffffffffd60,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &from_binder);
      this_02 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&stack0xfffffffffffffd60);
      _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_250._M_nxt = (_Hash_node_base *)_Var18._M_head_impl;
      LogicalOperator::AddChild
                (&this_02->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_250);
      _Var18._M_head_impl = (LogicalUpdate *)in_stack_fffffffffffffd60._M_head_impl;
      if ((element_type *)local_250._M_nxt != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_250._M_nxt)->_M_nxt)->
                    __weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
        _Var18._M_head_impl = (LogicalUpdate *)in_stack_fffffffffffffd60._M_head_impl;
      }
      local_250._M_nxt = (__node_base_ptr)0x0;
      in_stack_fffffffffffffd60._M_head_impl = (LogicalFilter *)0x0;
      if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(_Var19._M_pi)->_vptr__Sp_counted_base[1])();
        if ((_Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>)
            in_stack_fffffffffffffd60._M_head_impl != (LogicalFilter *)0x0) {
          (**(code **)(*(_func_int **)in_stack_fffffffffffffd60._M_head_impl + 8))();
        }
      }
      if (from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        (*(code *)((((from_binder.internal.
                      super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&bound_crossproduct);
    }
    pLVar13 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator*((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                         *)&stack0xfffffffffffffd48);
    _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_280 = (undefined1  [8])_Var18._M_head_impl;
    table = (TableCatalogEntry *)
            unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
            operator*(this_00);
    unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::operator->
              ((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                *)&stack0xfffffffffffffd48);
    BindUpdateSet((Binder *)&stack0xfffffffffffffd60,(LogicalOperator *)this,
                  (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)pLVar13,(UpdateSetInfo *)local_280,table,
                  (vector<duckdb::PhysicalIndex,_true> *)args);
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_280 !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                   &((BaseExpression *)local_280)->_vptr_BaseExpression)->internal).
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_280 = (undefined1  [8])0x0;
    _Var20._M_head_impl = (LogicalFilter *)0x0;
    local_288._M_head_impl = in_stack_fffffffffffffd60._M_head_impl;
    pLVar14 = optional_ptr<duckdb::LogicalGet,_true>::operator*(&get);
    pLVar15 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator*((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                           *)&stack0xfffffffffffffd78);
    pLVar13 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator*((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                         *)&stack0xfffffffffffffd48);
    (*(args->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x18])
              (args,this,pLVar14,pLVar15,pLVar13,this->context);
    pLVar14 = optional_ptr<duckdb::LogicalGet,_true>::operator*(&get);
    pBVar8 = (Binder *)&stack0xfffffffffffffd78;
    pLVar16 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)pBVar8);
    BindRowIdColumns(pBVar8,args,pLVar14,&(pLVar16->super_LogicalOperator).expressions);
    pLVar11 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd48);
    local_258._M_nxt = (_Hash_node_base *)local_288._M_head_impl;
    local_288._M_head_impl = (LogicalFilter *)0x0;
    LogicalOperator::AddChild
              (&pLVar11->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_258);
    if ((element_type *)local_258._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_258._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_258._M_nxt = (_Hash_node_base *)0x0;
    update_table_index = GenerateTableIndex(this);
    pLVar11 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd48);
    pLVar11->table_index = update_table_index;
    p_Var1 = (__node_base_ptr)
             (stmt->returning_list).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (__node_base_ptr)
             (stmt->returning_list).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var1 == p_Var2) {
      ::std::__cxx11::string::string
                ((string *)&bound_crossproduct,"Count",(allocator *)&stack0xfffffffffffffd5f);
      __l._M_len = 1;
      __l._M_array = (iterator)&bound_crossproduct;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&from_binder,__l,(allocator_type *)&stack0xfffffffffffffd77);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&result.names,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&from_binder);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_binder);
      ::std::__cxx11::string::~string((string *)&bound_crossproduct);
      LogicalType::LogicalType((LogicalType *)&from_binder,BIGINT);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&from_binder;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &bound_crossproduct,__l_00,(allocator_type *)&stack0xfffffffffffffd5f);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&result.types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &bound_crossproduct);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &bound_crossproduct);
      LogicalType::~LogicalType((LogicalType *)&from_binder);
      _Var18._M_head_impl = (LogicalUpdate *)0x0;
      _Var4._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
           (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            )(tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
             in_stack_fffffffffffffd48._M_head_impl;
      if (result.plan.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
           )0x0) {
        lVar3 = *(long *)result.plan.
                         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        result.plan.
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             in_stack_fffffffffffffd48._M_head_impl;
        (**(code **)(lVar3 + 8))();
        _Var4._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
             (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
             result.plan.
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      }
      result.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           _Var4._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pSVar10 = GetStatementProperties(this);
      pSVar10->allow_stream_result = false;
      pSVar10->return_type = CHANGED_ROWS;
      BoundStatement::BoundStatement(__return_storage_ptr__,&result);
    }
    else {
      _Var18._M_head_impl = (LogicalUpdate *)0x0;
      local_160.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (stmt->returning_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (stmt->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (stmt->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (stmt->returning_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_160.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var1;
      local_160.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2;
      pTVar17 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                operator->(&stmt->table);
      local_148._0_8_ =
           result.plan.
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      result.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      local_148._8_8_ =
           result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_148._16_8_ =
           result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_148._24_8_ =
           result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148._32_8_ =
           result.names.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_148._40_8_ =
           result.names.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_148._48_8_ =
           result.names.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result_00.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var18._M_head_impl;
      result_00.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           local_148;
      result_00.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var19._M_pi;
      result_00.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd58;
      result_00.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var20._M_head_impl;
      result_00.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd68._M_head_impl;
      result_00.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd70._M_nxt
      ;
      local_260._M_head_impl = in_stack_fffffffffffffd48._M_head_impl;
      BindReturning(__return_storage_ptr__,this,
                    (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)&local_160,args,&pTVar17->alias,update_table_index,
                    (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     )&local_260,result_00);
      BoundStatement::~BoundStatement((BoundStatement *)local_148);
      if (local_260._M_head_impl != (LogicalUpdate *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_260._M_head_impl)->super_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      local_260._M_head_impl = (LogicalUpdate *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_160);
    }
    if (local_288._M_head_impl != (LogicalFilter *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
    if ((__uniq_ptr_impl<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>_>)
        _Var18._M_head_impl !=
        (__uniq_ptr_impl<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>_>)0x0) {
      (**(code **)(*(long *)_Var18._M_head_impl + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
        in_stack_fffffffffffffd68._M_head_impl != (BoundTableRef *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_fffffffffffffd68._M_head_impl)->_vptr__Sp_counted_base)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(_Var19._M_pi)->_vptr__Sp_counted_base[1])();
    }
    BoundStatement::~BoundStatement(&result);
    return __return_storage_ptr__;
  }
  this_03 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&bound_crossproduct,"Can only update base table!",(allocator *)&from_binder);
  BinderException::BinderException(this_03,(string *)&bound_crossproduct);
  __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::Bind(UpdateStatement &stmt) {
	BoundStatement result;
	unique_ptr<LogicalOperator> root;

	// visit the table reference
	auto bound_table = Bind(*stmt.table);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw BinderException("Can only update base table!");
	}
	auto &table_binding = bound_table->Cast<BoundBaseTableRef>();
	auto &table = table_binding.table;

	// Add CTEs as bindable
	AddCTEMap(stmt.cte_map);

	optional_ptr<LogicalGet> get;
	if (stmt.from_table) {
		auto from_binder = Binder::CreateBinder(context, this);
		BoundJoinRef bound_crossproduct(JoinRefType::CROSS);
		bound_crossproduct.left = std::move(bound_table);
		bound_crossproduct.right = from_binder->Bind(*stmt.from_table);
		root = CreatePlan(bound_crossproduct);
		get = &root->children[0]->Cast<LogicalGet>();
		bind_context.AddContext(std::move(from_binder->bind_context));
	} else {
		root = CreatePlan(*bound_table);
		get = &root->Cast<LogicalGet>();
	}

	if (!table.temporary) {
		// update of persistent table: not read only!
		auto &properties = GetStatementProperties();
		properties.RegisterDBModify(table.catalog, context);
	}
	auto update = make_uniq<LogicalUpdate>(table);

	// set return_chunk boolean early because it needs uses update_is_del_and_insert logic
	if (!stmt.returning_list.empty()) {
		update->return_chunk = true;
	}
	// bind the default values
	auto &catalog_name = table.ParentCatalog().GetName();
	auto &schema_name = table.ParentSchema().name;
	BindDefaultValues(table.GetColumns(), update->bound_defaults, catalog_name, schema_name);
	update->bound_constraints = BindConstraints(table);

	// project any additional columns required for the condition/expressions
	if (stmt.set_info->condition) {
		WhereBinder binder(*this, context);
		auto condition = binder.Bind(stmt.set_info->condition);

		PlanSubqueries(condition, root);
		auto filter = make_uniq<LogicalFilter>(std::move(condition));
		filter->AddChild(std::move(root));
		root = std::move(filter);
	}

	D_ASSERT(stmt.set_info);
	D_ASSERT(stmt.set_info->columns.size() == stmt.set_info->expressions.size());

	auto proj_tmp = BindUpdateSet(*update, std::move(root), *stmt.set_info, table, update->columns);
	D_ASSERT(proj_tmp->type == LogicalOperatorType::LOGICAL_PROJECTION);
	auto proj = unique_ptr_cast<LogicalOperator, LogicalProjection>(std::move(proj_tmp));

	// bind any extra columns necessary for CHECK constraints or indexes
	table.BindUpdateConstraints(*this, *get, *proj, *update, context);

	// finally bind the row id column and add them to the projection list
	BindRowIdColumns(table, *get, proj->expressions);

	// set the projection as child of the update node and finalize the result
	update->AddChild(std::move(proj));

	auto update_table_index = GenerateTableIndex();
	update->table_index = update_table_index;
	if (!stmt.returning_list.empty()) {
		unique_ptr<LogicalOperator> update_as_logicaloperator = std::move(update);

		return BindReturning(std::move(stmt.returning_list), table, stmt.table->alias, update_table_index,
		                     std::move(update_as_logicaloperator), std::move(result));
	}

	result.names = {"Count"};
	result.types = {LogicalType::BIGINT};
	result.plan = std::move(update);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::CHANGED_ROWS;
	return result;
}